

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O0

void stripctrl_locale_put_wc(StripCtrlCharsImpl *scc,wchar_t wc)

{
  _Bool _Var1;
  int iVar2;
  size_t len;
  size_t produced;
  char outbuf [16];
  wchar_t width;
  wchar_t wc_local;
  StripCtrlCharsImpl *scc_local;
  
  outbuf._12_4_ = wc;
  outbuf._8_4_ = mk_wcwidth(wc);
  iVar2 = iswprint(outbuf._12_4_);
  if (((iVar2 != 0) && (-1 < (int)outbuf._8_4_)) ||
     (_Var1 = stripctrl_ctrlchar_ok(scc,outbuf._12_4_), _Var1)) {
    if ((int)outbuf._8_4_ < 0) {
      outbuf[8] = '\0';
      outbuf[9] = '\0';
      outbuf[10] = '\0';
      outbuf[0xb] = '\0';
    }
  }
  else {
    if (scc->substitution == L'\0') {
      return;
    }
    outbuf._12_4_ = scc->substitution;
    outbuf._8_4_ = mk_wcwidth(outbuf._12_4_);
    if ((int)outbuf._8_4_ < 0) {
      __assert_fail("width >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                    ,0xaa,"void stripctrl_locale_put_wc(StripCtrlCharsImpl *, wchar_t)");
    }
  }
  stripctrl_check_line_limit(scc,outbuf._12_4_,(long)(int)outbuf._8_4_);
  len = wcrtomb((char *)&produced,outbuf._12_4_,(mbstate_t *)&scc->mbs_out);
  if (len != 0) {
    BinarySink_put_data(scc->bs_out->binarysink_,&produced,len);
  }
  return;
}

Assistant:

static inline void stripctrl_locale_put_wc(StripCtrlCharsImpl *scc, wchar_t wc)
{
    int width = mk_wcwidth(wc);
    if ((iswprint(wc) && width >= 0) || stripctrl_ctrlchar_ok(scc, wc)) {
        /* Printable character, or one we're going to let through anyway. */
        if (width < 0)
            width = 0;   /* sanitise for stripctrl_check_line_limit */
    } else if (scc->substitution) {
        wc = scc->substitution;
        width = mk_wcwidth(wc);
        assert(width >= 0);
    } else {
        /* No defined substitution, so don't write any output wchar_t. */
        return;
    }

    stripctrl_check_line_limit(scc, wc, width);

    char outbuf[MB_LEN_MAX];
    size_t produced = wcrtomb(outbuf, wc, &scc->mbs_out);
    if (produced > 0)
        put_data(scc->bs_out, outbuf, produced);
}